

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

void __thiscall
tinyusdz::primvar::PrimVar::set_value<tinyusdz::value::texcoord2d>(PrimVar *this,texcoord2d *v)

{
  texcoord2d *v_local;
  PrimVar *this_local;
  
  tinyusdz::value::Value::operator=(&this->_value,v);
  return;
}

Assistant:

void set_value(const T &v) {
    _value = v;
  }